

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_strings.cpp
# Opt level: O2

char * __thiscall
pstore::exchange::export_ns::string_mapping::index(string_mapping *this,char *__s,int __c)

{
  const_iterator cVar1;
  key_type local_8;
  
  local_8.a_ = (value_type)__s;
  cVar1 = std::
          _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,&local_8);
  if (cVar1.super__Node_iterator_base<std::pair<const_pstore::address,_unsigned_long>,_true>._M_cur
      != (__node_type *)0x0) {
    return *(char **)((long)cVar1.
                            super__Node_iterator_base<std::pair<const_pstore::address,_unsigned_long>,_true>
                            ._M_cur + 0x10);
  }
  assert_failed("pos != strings_.end ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_strings.cpp"
                ,0x2b);
}

Assistant:

std::uint64_t string_mapping::index (typed_address<indirect_string> const addr) const {
                auto const pos = strings_.find (addr.to_address ());
                PSTORE_ASSERT (pos != strings_.end ());
                return pos->second;
            }